

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O2

void printTimeForDebug(int choice,time_t start,time_t finish)

{
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  ofstream outfile;
  
  pcVar1 = catStrStr(draftAddress,"time.txt");
  std::ofstream::ofstream(&outfile,pcVar1,_S_app);
  if ((uint)choice < 7) {
    std::operator<<((ostream *)&outfile,(&PTR_anon_var_dwarf_3b10_00107d80)[(uint)choice]);
  }
  lVar3 = finish - start;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&outfile,(int)(lVar3 / 0xe10));
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)((lVar3 / 0x3c) % 0x3c));
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(lVar3 % 0x3c));
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::close();
  std::ofstream::~ofstream(&outfile);
  return;
}

Assistant:

void printTimeForDebug(int choice, time_t start, time_t finish){
    const char *timeFile = catStrStr(draftAddress, "time.txt");
    ofstream outfile(timeFile, ios::app);
    long duration;
    duration = finish-start;
    switch (choice){
        case 0: outfile << "TOTAL Time: \n"; break;
        case 1: outfile << "Cost 1 : "; break;
        case 2: outfile << "Cost 2 : "; break;
        case 3: outfile << "Transfer Time: "; break;
        case 4: outfile << "Input Time: "; break;
        case 5: outfile << "Adaption Time: "; break;
        case 6: outfile << "IntoRep Time: "; break;
        default: break;
    }
    int seconds = duration % 60;
    duration /= 60;
    int minutes = duration % 60;
    duration /= 60;
    int hours = duration;

    outfile << hours << ":" << minutes << ":" << seconds << endl;
    outfile.close();
}